

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTexture.cpp
# Opt level: O0

PixelBufferAccess * __thiscall
glu::TextureBuffer::getFullRefTexture(PixelBufferAccess *__return_storage_ptr__,TextureBuffer *this)

{
  void *pvVar1;
  size_t local_58;
  Vector<int,_3> local_38;
  int local_2c;
  size_t sStack_28;
  int bufferLengthPixels;
  size_t bufferLengthBytes;
  TextureFormat format;
  TextureBuffer *this_local;
  
  format = (TextureFormat)this;
  bufferLengthBytes = (size_t)mapGLInternalFormat(this->m_format);
  if (this->m_size == 0) {
    local_58 = de::ArrayBuffer<unsigned_char,_1UL,_1UL>::size(&this->m_refBuffer);
  }
  else {
    local_58 = this->m_size;
  }
  sStack_28 = local_58;
  local_2c = tcu::TextureFormat::getPixelSize((TextureFormat *)&bufferLengthBytes);
  local_2c = (int)local_58 / local_2c;
  tcu::Vector<int,_3>::Vector(&local_38,local_2c,1,1);
  pvVar1 = de::ArrayBuffer<unsigned_char,_1UL,_1UL>::getPtr(&this->m_refBuffer);
  tcu::PixelBufferAccess::PixelBufferAccess
            (__return_storage_ptr__,(TextureFormat *)&bufferLengthBytes,&local_38,
             (void *)((long)pvVar1 + this->m_offset));
  return __return_storage_ptr__;
}

Assistant:

const tcu::PixelBufferAccess TextureBuffer::getFullRefTexture (void)
{
	const tcu::TextureFormat	format				= mapGLInternalFormat(m_format);
	const size_t				bufferLengthBytes	= (m_size != 0) ? (m_size) : (m_refBuffer.size());
	const int					bufferLengthPixels	= (int)bufferLengthBytes / format.getPixelSize();

	return tcu::PixelBufferAccess(format,
								  tcu::IVec3(bufferLengthPixels, 1, 1),
								  (deUint8*)m_refBuffer.getPtr() + m_offset);
}